

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::logFlushOrFinishAfterEnqueueStart
          (CLIntercept *this,char *flushOrFinish,char *functionName)

{
  double __x;
  allocator local_e2;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::mutex::lock(&this->m_Mutex);
  std::__cxx11::string::string((string *)&local_c0,flushOrFinish,&local_e1);
  std::operator+(&local_a0,"Calling ",&local_c0);
  std::operator+(&local_80,&local_a0," after ");
  std::__cxx11::string::string((string *)&local_e0,functionName,&local_e2);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,"...\n");
  log(this,__x);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::logFlushOrFinishAfterEnqueueStart(
    const char* flushOrFinish,
    const char* functionName )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Calling " + std::string(flushOrFinish) + " after " + std::string(functionName) + "...\n" );
}